

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.h
# Opt level: O0

void __thiscall dh::trival::trival(trival *this,trival *param_1)

{
  trival *param_1_local;
  trival *this_local;
  
  trivalitem::trivalitem(&this->_res,&param_1->_res);
  std::__cxx11::string::string((string *)&this->_operand,(string *)&param_1->_operand);
  trivalitem::trivalitem(&this->_val1,&param_1->_val1);
  trivalitem::trivalitem(&this->_val2,&param_1->_val2);
  this->size = param_1->size;
  return;
}

Assistant:

trival( ::std::string operand)
		{
			this->_operand = operand;
			size = 0;
		}